

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_common.cpp
# Opt level: O0

void cfd::UtxoUtil::ConvertToUtxo(UtxoData *utxo_data,Utxo *utxo,UtxoData *dest)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  AddressType AVar5;
  bool bVar6;
  byte bVar7;
  uint32_t uVar8;
  DescriptorScriptType DVar9;
  int64_t iVar10;
  undefined8 *puVar11;
  uchar *puVar12;
  ulong uVar13;
  reference pvVar14;
  reference this;
  size_type sVar15;
  void *__dest;
  long in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset;
  Script *scriptsig_template;
  uint32_t txin_size;
  uint32_t wit_size;
  AddressType addr_type;
  DescriptorScriptReference *script_ref;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  ref_list;
  Descriptor desc;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  elements_prefixes;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> addr_prefixes;
  NetType net_type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> locking_script_bytes;
  ByteData txid;
  ByteData block_hash;
  UtxoData output;
  UtxoData *in_stack_fffffffffffff358;
  UtxoData *in_stack_fffffffffffff360;
  undefined4 in_stack_fffffffffffff368;
  undefined4 in_stack_fffffffffffff36c;
  Script *in_stack_fffffffffffff370;
  UtxoData *in_stack_fffffffffffff3c8;
  undefined7 in_stack_fffffffffffff3d0;
  undefined1 in_stack_fffffffffffff3d7;
  bool local_c1d;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_fffffffffffff3f8;
  undefined4 in_stack_fffffffffffff400;
  undefined4 in_stack_fffffffffffff404;
  uint uVar16;
  Script local_b80;
  Script local_b48;
  Script local_b10;
  ByteData local_ad8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_ac0;
  Script *local_aa8;
  undefined1 local_a9c [11];
  byte local_a91;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_a90;
  ByteData local_a78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a60;
  AddressType local_a44;
  ByteData local_a40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a28;
  Script local_a10;
  string local_9d8;
  Script local_9b8;
  Address local_980;
  ByteData local_808;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_7f0;
  Script local_7d8;
  reference local_7a0;
  vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
  local_798;
  Descriptor local_780;
  AddressFormatData local_618;
  string local_5e8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_5b0;
  NetType local_594;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_590 [24];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_578;
  ByteData local_560;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_548;
  ByteData local_530 [5];
  Script local_4b8;
  Script local_480;
  Address local_448;
  AddressType local_2a0;
  Script local_50;
  long local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  if (in_RSI != (undefined8 *)0x0) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_RDI;
    UtxoData::UtxoData((UtxoData *)CONCAT17(in_stack_fffffffffffff3d7,in_stack_fffffffffffff3d0),
                       in_stack_fffffffffffff3c8);
    local_10[0x18] = 0;
    local_10[0x19] = 0;
    local_10[0x16] = 0;
    local_10[0x17] = 0;
    local_10[0x14] = 0;
    local_10[0x15] = 0;
    local_10[0x12] = 0;
    local_10[0x13] = 0;
    local_10[0x10] = 0;
    local_10[0x11] = 0;
    local_10[0xe] = 0;
    local_10[0xf] = 0;
    local_10[0xc] = 0;
    local_10[0xd] = 0;
    local_10[10] = 0;
    local_10[0xb] = 0;
    local_10[8] = 0;
    local_10[9] = 0;
    local_10[6] = 0;
    local_10[7] = 0;
    local_10[4] = 0;
    local_10[5] = 0;
    local_10[2] = 0;
    local_10[3] = 0;
    *local_10 = 0;
    local_10[1] = 0;
    local_10[0x1a] = 0;
    *local_10 = *local_8;
    *(undefined4 *)(local_10 + 9) = *(undefined4 *)(local_8 + 9);
    local_10[0x16] = local_8[0x4e];
    iVar10 = core::Amount::GetSatoshiValue((Amount *)(local_8 + 0x4b));
    local_10[0x10] = iVar10;
    core::BlockHash::GetData(local_530,(BlockHash *)(local_8 + 1));
    bVar6 = core::ByteData::Empty(local_530);
    puVar4 = local_10;
    if (!bVar6) {
      puVar11 = local_10 + 1;
      core::ByteData::GetBytes(&local_548,local_530);
      puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x5092e4);
      *puVar11 = *(undefined8 *)puVar12;
      puVar4[2] = *(undefined8 *)(puVar12 + 8);
      puVar4[3] = *(undefined8 *)(puVar12 + 0x10);
      puVar4[4] = *(undefined8 *)(puVar12 + 0x18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff370)
      ;
    }
    core::Txid::GetData(&local_560,(Txid *)(local_8 + 5));
    bVar6 = core::ByteData::Empty(&local_560);
    puVar4 = local_10;
    if (!bVar6) {
      puVar11 = local_10 + 5;
      core::ByteData::GetBytes(&local_578,&local_560);
      puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x5093c8);
      *puVar11 = *(undefined8 *)puVar12;
      puVar4[6] = *(undefined8 *)(puVar12 + 8);
      puVar4[7] = *(undefined8 *)(puVar12 + 0x10);
      puVar4[8] = *(undefined8 *)(puVar12 + 0x18);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff370)
      ;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x509426);
    uVar13 = std::__cxx11::string::empty();
    if ((uVar13 & 1) == 0) {
      local_594 = kMainnet;
      core::GetBitcoinAddressFormatList();
      bVar6 = core::ConfidentialAssetId::IsEmpty((ConfidentialAssetId *)(local_8 + 0x4f));
      if (!bVar6) {
        core::GetElementsAddressFormatList();
        std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
        operator=((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                   *)CONCAT44(in_stack_fffffffffffff404,in_stack_fffffffffffff400),
                  in_stack_fffffffffffff3f8);
        local_594 = kLiquidV1;
        std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
        ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 *)in_stack_fffffffffffff370);
      }
      core::Address::GetAddress_abi_cxx11_(&local_5e8,(Address *)(local_8 + 0x18));
      bVar7 = std::__cxx11::string::empty();
      std::__cxx11::string::~string((string *)&local_5e8);
      if (((bVar7 ^ 0xff) & 1) != 0) {
        std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
        clear((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )0x509580);
        core::Address::GetAddressFormatData(&local_618,(Address *)(local_8 + 0x18));
        std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
        push_back((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                   *)in_stack_fffffffffffff360,(value_type *)in_stack_fffffffffffff358);
        core::AddressFormatData::~AddressFormatData((AddressFormatData *)0x5095c2);
        local_594 = core::Address::GetNetType((Address *)(local_8 + 0x18));
      }
      core::Descriptor::Parse(&local_780,(string *)(local_8 + 0x47),&local_5b0);
      uVar8 = core::Descriptor::GetNeedArgumentNum(&local_780);
      if (uVar8 == 0) {
        core::Descriptor::GetReferenceAll
                  (&local_798,&local_780,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x0);
        local_7a0 = std::
                    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                    ::operator[](&local_798,0);
        core::DescriptorScriptReference::GetLockingScript(&local_7d8,local_7a0);
        core::Script::operator=(&local_4b8,&local_7d8);
        core::Script::~Script((Script *)in_stack_fffffffffffff360);
        core::Script::GetData(&local_808,&local_4b8);
        core::ByteData::GetBytes(&local_7f0,&local_808);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff370,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff370);
        core::ByteData::~ByteData((ByteData *)0x509735);
        DVar9 = core::DescriptorScriptReference::GetScriptType(local_7a0);
        if ((DVar9 != kDescriptorScriptRaw) ||
           (bVar6 = core::DescriptorScriptReference::HasAddress(local_7a0), bVar6)) {
          local_2a0 = core::DescriptorScriptReference::GetAddressType(local_7a0);
          core::DescriptorScriptReference::GenerateAddress(&local_980,local_7a0,local_594);
          core::Address::operator=(&local_448,&local_980);
          core::Address::~Address((Address *)in_stack_fffffffffffff360);
          sVar15 = std::
                   vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                   ::size(&local_798);
          pvVar14 = std::
                    vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                    ::operator[](&local_798,sVar15 - 1);
          bVar6 = core::DescriptorScriptReference::HasRedeemScript(pvVar14);
          if (bVar6) {
            sVar15 = std::
                     vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                     ::size(&local_798);
            pvVar14 = std::
                      vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
                      ::operator[](&local_798,sVar15 - 1);
            core::DescriptorScriptReference::GetRedeemScript(&local_9b8,pvVar14);
            core::Script::operator=(&local_480,&local_9b8);
            core::Script::~Script((Script *)in_stack_fffffffffffff360);
          }
        }
        *(short *)((long)local_10 + 0x76) = (short)local_2a0;
        std::
        vector<cfd::core::DescriptorScriptReference,_std::allocator<cfd::core::DescriptorScriptReference>_>
        ::~vector(&local_798);
      }
      core::Descriptor::~Descriptor((Descriptor *)0x509993);
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )in_stack_fffffffffffff370);
    }
    bVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(local_590);
    if (bVar6) {
      core::Address::GetAddress_abi_cxx11_(&local_9d8,&local_448);
      bVar7 = std::__cxx11::string::empty();
      uVar16 = (uint)bVar7 << 0x18 ^ 0xff000000;
      std::__cxx11::string::~string((string *)&local_9d8);
      if ((uVar16 & 0x1000000) == 0) {
        bVar6 = core::Script::IsEmpty((Script *)(local_8 + 10));
        if (!bVar6) {
          core::Script::GetData(&local_a78,(Script *)(local_8 + 10));
          core::ByteData::GetBytes(&local_a60,&local_a78);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff370,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffff370);
          core::ByteData::~ByteData((ByteData *)0x509c0e);
          bVar6 = core::Script::IsP2wpkhScript((Script *)(local_8 + 10));
          if (bVar6) {
            *(undefined2 *)((long)local_10 + 0x76) = 4;
          }
          else {
            bVar6 = core::Script::IsP2wshScript((Script *)(local_8 + 10));
            if (bVar6) {
              *(undefined2 *)((long)local_10 + 0x76) = 3;
            }
            else {
              bVar6 = core::Script::IsP2pkhScript((Script *)(local_8 + 10));
              if (bVar6) {
                *(undefined2 *)((long)local_10 + 0x76) = 2;
              }
              else {
                bVar6 = core::Script::IsTaprootScript((Script *)(local_8 + 10));
                if (bVar6) {
                  *(undefined2 *)((long)local_10 + 0x76) = 7;
                }
                else {
                  local_a91 = 0;
                  bVar6 = core::Script::IsWitnessProgram((Script *)(local_8 + 10));
                  local_c1d = false;
                  if (bVar6) {
                    core::Script::GetElementList(&local_a90,(Script *)(local_8 + 10));
                    local_a91 = 1;
                    this = std::
                           vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                           ::operator[](&local_a90,0);
                    iVar10 = core::ScriptElement::GetNumber(this);
                    local_c1d = iVar10 != 0;
                  }
                  if ((local_a91 & 1) != 0) {
                    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                    ::~vector((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                               *)in_stack_fffffffffffff370);
                  }
                  if ((local_c1d & 1U) == 0) {
                    *(undefined2 *)((long)local_10 + 0x76) = 1;
                  }
                  else {
                    *(undefined2 *)((long)local_10 + 0x76) = 8;
                  }
                }
              }
            }
          }
          local_2a0 = (AddressType)*(ushort *)((long)local_10 + 0x76);
        }
      }
      else {
        core::Address::GetLockingScript(&local_a10,&local_448);
        core::Script::operator=(&local_4b8,&local_a10);
        core::Script::~Script((Script *)in_stack_fffffffffffff360);
        core::Script::GetData(&local_a40,&local_4b8);
        core::ByteData::GetBytes(&local_a28,&local_a40);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff370,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT44(in_stack_fffffffffffff36c,in_stack_fffffffffffff368));
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffff370);
        core::ByteData::~ByteData((ByteData *)0x509ac1);
        local_a44 = core::Address::GetAddressType(&local_448);
        AVar5 = local_a44;
        if ((local_a44 == kP2shAddress) &&
           ((local_2a0 == kP2shP2wshAddress || (AVar5 = local_a44, local_2a0 == kP2shP2wpkhAddress))
           )) {
          AVar5 = local_2a0;
        }
        local_2a0 = AVar5;
        *(short *)((long)local_10 + 0x76) = (short)local_2a0;
      }
    }
    bVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(local_590);
    if (!bVar6) {
      sVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_590);
      *(short *)((long)local_10 + 0x74) = (short)sVar15;
      if (*(ushort *)((long)local_10 + 0x74) < 0x28) {
        __dest = (void *)((long)local_10 + 0x4c);
        puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x509eab);
        memcpy(__dest,puVar12,(ulong)*(ushort *)((long)local_10 + 0x74));
      }
    }
    local_a9c._4_4_ = 0;
    local_a9c._0_4_ = 0;
    local_aa8 = (Script *)0x0;
    bVar6 = core::Script::IsEmpty(&local_50);
    if (!bVar6) {
      local_aa8 = &local_50;
    }
    bVar6 = core::ConfidentialAssetId::IsEmpty((ConfidentialAssetId *)(local_8 + 0x4f));
    if (!bVar6) {
      core::ConfidentialAssetId::GetData(&local_ad8,(ConfidentialAssetId *)(local_8 + 0x4f));
      core::ByteData::GetBytes(&local_ac0,&local_ad8);
      core::ByteData::~ByteData((ByteData *)0x509f87);
      puVar4 = local_10;
      puVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x509fa1);
      *(uchar *)((long)puVar4 + 0xa9) = puVar12[0x20];
      uVar1 = *(undefined8 *)puVar12;
      uVar2 = *(undefined8 *)(puVar12 + 8);
      uVar3 = *(undefined8 *)(puVar12 + 0x18);
      *(undefined8 *)((long)puVar4 + 0x99) = *(undefined8 *)(puVar12 + 0x10);
      *(undefined8 *)((long)puVar4 + 0xa1) = uVar3;
      *(undefined8 *)((long)puVar4 + 0x89) = uVar1;
      *(undefined8 *)((long)puVar4 + 0x91) = uVar2;
      bVar6 = core::ConfidentialAssetId::HasBlinding((ConfidentialAssetId *)(local_8 + 0x4f));
      AVar5 = local_2a0;
      *(bool *)(local_10 + 0x11) = bVar6;
      core::Script::Script(&local_b10,&local_480);
      core::Script::Script(&local_b48);
      in_stack_fffffffffffff360 = (UtxoData *)local_a9c;
      in_stack_fffffffffffff358 = (UtxoData *)(local_a9c + 4);
      in_stack_fffffffffffff370 = local_aa8;
      core::ConfidentialTxIn::EstimateTxInSize
                (AVar5,&local_b10,0,&local_b48,false,false,(uint32_t *)in_stack_fffffffffffff358,
                 (uint32_t *)in_stack_fffffffffffff360,false,local_aa8,0,0x34,(uint32_t *)0x0,0);
      core::Script::~Script((Script *)in_stack_fffffffffffff360);
      core::Script::~Script((Script *)in_stack_fffffffffffff360);
      local_a9c._0_4_ = local_a9c._0_4_ - 0x29;
      *(short *)(local_10 + 0xf) = (short)local_a9c._4_4_;
      *(short *)((long)local_10 + 0x7a) = (short)local_a9c._0_4_;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff370)
      ;
    }
    AVar5 = local_2a0;
    if ((local_a9c._4_4_ == 0) && (local_a9c._0_4_ == 0)) {
      local_a9c._4_4_ = 0;
      local_a9c._0_4_ = 0;
      core::Script::Script(&local_b80,&local_480);
      core::TxIn::EstimateTxInSize
                (AVar5,&local_b80,(uint32_t *)(local_a9c + 4),(uint32_t *)local_a9c,local_aa8);
      core::Script::~Script((Script *)in_stack_fffffffffffff360);
      local_a9c._0_4_ = local_a9c._0_4_ - 0x29;
      *(short *)(local_10 + 0xf) = (short)local_a9c._4_4_;
      *(short *)((long)local_10 + 0x7a) = (short)local_a9c._0_4_;
    }
    if (local_18 != 0) {
      UtxoData::operator=(in_stack_fffffffffffff360,in_stack_fffffffffffff358);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff370);
    core::ByteData::~ByteData((ByteData *)0x50a2c1);
    core::ByteData::~ByteData((ByteData *)0x50a2ce);
    UtxoData::~UtxoData(in_stack_fffffffffffff360);
  }
  return;
}

Assistant:

void UtxoUtil::ConvertToUtxo(
    const UtxoData& utxo_data, Utxo* utxo, UtxoData* dest) {
  if (utxo != nullptr) {
    UtxoData output(utxo_data);
    memset(utxo, 0, sizeof(Utxo));
    utxo->block_height = utxo_data.block_height;
    utxo->vout = utxo_data.vout;
    utxo->binary_data = utxo_data.binary_data;
    utxo->amount = utxo_data.amount.GetSatoshiValue();

    ByteData block_hash = utxo_data.block_hash.GetData();
    if (!block_hash.Empty()) {
      memcpy(
          utxo->block_hash, block_hash.GetBytes().data(),
          sizeof(utxo->block_hash));
    }
    ByteData txid = utxo_data.txid.GetData();
    if (!txid.Empty()) {
      memcpy(utxo->txid, txid.GetBytes().data(), sizeof(utxo->txid));
    }

    // convert from descriptor
    std::vector<uint8_t> locking_script_bytes;
    if (!utxo_data.descriptor.empty()) {
      NetType net_type = NetType::kMainnet;
      std::vector<AddressFormatData> addr_prefixes =
          cfd::core::GetBitcoinAddressFormatList();
#ifndef CFD_DISABLE_ELEMENTS
      if (!utxo_data.asset.IsEmpty()) {
        std::vector<AddressFormatData> elements_prefixes =
            cfd::core::GetElementsAddressFormatList();
        addr_prefixes = elements_prefixes;
        net_type = NetType::kLiquidV1;
      }
#endif  // CFD_DISABLE_ELEMENTS
      if (!utxo_data.address.GetAddress().empty()) {
        addr_prefixes.clear();
        addr_prefixes.push_back(utxo_data.address.GetAddressFormatData());
        net_type = utxo_data.address.GetNetType();
      }

      Descriptor desc =
          Descriptor::Parse(utxo_data.descriptor, &addr_prefixes);
      if (desc.GetNeedArgumentNum() == 0) {
        std::vector<DescriptorScriptReference> ref_list =
            desc.GetReferenceAll();
        DescriptorScriptReference& script_ref = ref_list[0];
        output.locking_script = script_ref.GetLockingScript();
        locking_script_bytes = output.locking_script.GetData().GetBytes();
        if ((script_ref.GetScriptType() !=
             DescriptorScriptType::kDescriptorScriptRaw) ||
            script_ref.HasAddress()) {
          output.address_type = script_ref.GetAddressType();
          output.address = script_ref.GenerateAddress(net_type);
          if (ref_list[ref_list.size() - 1].HasRedeemScript()) {
            output.redeem_script =
                ref_list[ref_list.size() - 1].GetRedeemScript();
          }
        }
        utxo->address_type = static_cast<uint16_t>(output.address_type);
      }
    }

    if (!locking_script_bytes.empty()) {
      // do nothing
    } else if (!output.address.GetAddress().empty()) {
      output.locking_script = output.address.GetLockingScript();
      locking_script_bytes = output.locking_script.GetData().GetBytes();
      AddressType addr_type = output.address.GetAddressType();
      if ((addr_type == AddressType::kP2shAddress) &&
          ((output.address_type == AddressType::kP2shP2wshAddress) ||
           (output.address_type == AddressType::kP2shP2wpkhAddress))) {
        // direct set. output.address_type;
      } else {
        output.address_type = addr_type;
      }
      utxo->address_type = static_cast<uint16_t>(output.address_type);
    } else if (!utxo_data.locking_script.IsEmpty()) {
      locking_script_bytes = utxo_data.locking_script.GetData().GetBytes();
      if (utxo_data.locking_script.IsP2wpkhScript()) {
        utxo->address_type = AddressType::kP2wpkhAddress;
      } else if (utxo_data.locking_script.IsP2wshScript()) {
        utxo->address_type = AddressType::kP2wshAddress;
      } else if (utxo_data.locking_script.IsP2pkhScript()) {
        utxo->address_type = AddressType::kP2pkhAddress;
      } else if (utxo_data.locking_script.IsTaprootScript()) {
        utxo->address_type = AddressType::kTaprootAddress;
      } else if (
          utxo_data.locking_script.IsWitnessProgram() &&
          (utxo_data.locking_script.GetElementList()[0].GetNumber() != 0)) {
        utxo->address_type = AddressType::kWitnessUnknown;
      } else {  // TODO(k-matsuzawa): unbknown type is convert to p2sh
        utxo->address_type = AddressType::kP2shAddress;
      }
      output.address_type = static_cast<AddressType>(utxo->address_type);
    }

    if (!locking_script_bytes.empty()) {
      utxo->script_length = static_cast<uint16_t>(locking_script_bytes.size());
      if (utxo->script_length < sizeof(utxo->locking_script)) {
        memcpy(
            utxo->locking_script, locking_script_bytes.data(),
            utxo->script_length);
      }
    }

    uint32_t wit_size = 0;
    uint32_t txin_size = 0;
    const Script* scriptsig_template = nullptr;
    if (!output.scriptsig_template.IsEmpty()) {
      scriptsig_template = &output.scriptsig_template;
    }

#ifndef CFD_DISABLE_ELEMENTS
    if (!utxo_data.asset.IsEmpty()) {
      std::vector<uint8_t> asset = utxo_data.asset.GetData().GetBytes();
      memcpy(utxo->asset, asset.data(), sizeof(utxo->asset));
      utxo->blinded = utxo_data.asset.HasBlinding();

      ConfidentialTxIn::EstimateTxInSize(
          output.address_type, output.redeem_script, 0, Script(), false, false,
          &wit_size, &txin_size, false, scriptsig_template);
      txin_size -= static_cast<uint32_t>(TxIn::kMinimumTxInSize);
      utxo->witness_size_max = static_cast<uint16_t>(wit_size);
      utxo->uscript_size_max = static_cast<uint16_t>(txin_size);
    }
#endif  // CFD_DISABLE_ELEMENTS

    if ((wit_size == 0) && (txin_size == 0)) {
      wit_size = 0;
      txin_size = 0;
      TxIn::EstimateTxInSize(
          output.address_type, output.redeem_script, &wit_size, &txin_size,
          scriptsig_template);
      txin_size -= static_cast<uint32_t>(TxIn::kMinimumTxInSize);
      utxo->witness_size_max = static_cast<uint16_t>(wit_size);
      utxo->uscript_size_max = static_cast<uint16_t>(txin_size);
    }

    if (dest != nullptr) {
      *dest = output;
    }
  }
}